

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concavity.cpp
# Opt level: O3

bool ConvexDecomposition::featureMatch
               (CTri *m,CTriVector *tris,ConvexDecompInterface *callback,CTriVector *input_mesh)

{
  Vector3d *dir;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  bool bVar9;
  pointer pCVar10;
  pointer this;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  m->mConcavity = 0.0;
  this = (tris->
         super__Vector_base<ConvexDecomposition::CTri,_std::allocator<ConvexDecomposition::CTri>_>).
         _M_impl.super__Vector_impl_data._M_start;
  if (this == (tris->
              super__Vector_base<ConvexDecomposition::CTri,_std::allocator<ConvexDecomposition::CTri>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
LAB_00909e54:
    bVar9 = false;
  }
  else {
    dir = &m->mNormal;
    bVar9 = false;
    fVar11 = 0.707;
    do {
      while( true ) {
        pCVar10 = this + 1;
        bVar8 = CTri::samePlane(this,m);
        if (bVar8) goto LAB_00909e54;
        fVar1 = (this->mNormal).y;
        fVar2 = (this->mNormal).x;
        fVar3 = (this->mNormal).z;
        auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (m->mNormal).y)),ZEXT416((uint)fVar2),
                                  ZEXT416((uint)(m->mNormal).x));
        auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar3),ZEXT416((uint)(m->mNormal).z));
        if (fVar11 < auVar12._0_4_) break;
LAB_00909d23:
        this = pCVar10;
        if (pCVar10 ==
            (tris->
            super__Vector_base<ConvexDecomposition::CTri,_std::allocator<ConvexDecomposition::CTri>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          if (!bVar9) goto LAB_00909e54;
          goto LAB_00909d99;
        }
      }
      fVar4 = this->mPlaneD;
      auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (m->mP1).y)),ZEXT416((uint)fVar2),
                               ZEXT416((uint)(m->mP1).x));
      auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar3),ZEXT416((uint)(m->mP1).z));
      if (fVar4 + auVar7._0_4_ <= 0.001) {
        auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (m->mP2).y)),ZEXT416((uint)fVar2),
                                 ZEXT416((uint)(m->mP2).x));
        auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar3),ZEXT416((uint)(m->mP2).z));
        if (fVar4 + auVar7._0_4_ <= 0.001) {
          auVar7 = vfmadd132ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)(fVar1 * (m->mP3).y)),
                                   ZEXT416((uint)(m->mP3).x));
          auVar7 = vfmadd132ss_fma(ZEXT416((uint)fVar3),auVar7,ZEXT416((uint)(m->mP3).z));
          if (fVar4 + auVar7._0_4_ <= 0.001) goto LAB_00909d23;
        }
      }
      CTri::raySect(this,&m->mP1,dir,&m->mNear1);
      CTri::raySect(this,&m->mP2,dir,&m->mNear2);
      CTri::raySect(this,&m->mP3,dir,&m->mNear3);
      bVar9 = true;
      this = pCVar10;
      fVar11 = auVar12._0_4_;
    } while (pCVar10 !=
             (tris->
             super__Vector_base<ConvexDecomposition::CTri,_std::allocator<ConvexDecomposition::CTri>_>
             )._M_impl.super__Vector_impl_data._M_finish);
LAB_00909d99:
    auVar12._0_4_ = (m->mP1).x;
    auVar12._4_4_ = (m->mP1).y;
    auVar12._8_4_ = (m->mP1).z;
    auVar12._12_4_ = (m->mP2).x;
    auVar7._0_4_ = (m->mNear1).x;
    auVar7._4_4_ = (m->mNear1).y;
    auVar7._8_4_ = (m->mNear1).z;
    auVar7._12_4_ = (m->mNear2).x;
    bVar9 = true;
    auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)(m->mNear2).x),0x10);
    auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)(m->mP2).x),0x10);
    auVar14 = vinsertps_avx(*(undefined1 (*) [16])&(m->mP1).y,ZEXT416((uint)(m->mP2).y),0x10);
    auVar6 = vinsertps_avx(*(undefined1 (*) [16])&(m->mP1).z,ZEXT416((uint)(m->mP2).z),0x10);
    auVar7 = vsubps_avx(auVar7,auVar12);
    auVar12 = vinsertps_avx(*(undefined1 (*) [16])&(m->mNear1).y,ZEXT416((uint)(m->mNear2).y),0x10);
    auVar14 = vsubps_avx(auVar12,auVar14);
    auVar12 = vinsertps_avx(*(undefined1 (*) [16])&(m->mNear1).z,ZEXT416((uint)(m->mNear2).z),0x10);
    auVar13._0_4_ = auVar14._0_4_ * auVar14._0_4_;
    auVar13._4_4_ = auVar14._4_4_ * auVar14._4_4_;
    auVar13._8_4_ = auVar14._8_4_ * auVar14._8_4_;
    auVar13._12_4_ = auVar14._12_4_ * auVar14._12_4_;
    auVar7 = vfmadd231ps_fma(auVar13,auVar7,auVar7);
    auVar12 = vsubps_avx(auVar12,auVar6);
    auVar12 = vfmadd231ps_fma(auVar7,auVar12,auVar12);
    auVar7 = vsqrtps_avx(auVar12);
    uVar5 = vmovlps_avx(auVar7);
    m->mC1 = (float)(int)uVar5;
    m->mC2 = (float)(int)((ulong)uVar5 >> 0x20);
    fVar11 = (m->mNear3).y - (m->mP3).y;
    auVar12 = ZEXT416((uint)((m->mNear3).x - (m->mP3).x));
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar11)),auVar12,auVar12);
    auVar14 = ZEXT416((uint)((m->mNear3).z - (m->mP3).z));
    auVar12 = vfmadd231ss_fma(auVar12,auVar14,auVar14);
    auVar14 = vsqrtss_avx(auVar12,auVar12);
    auVar12 = vmovshdup_avx(auVar7);
    auVar12 = vmaxss_avx(auVar12,auVar7);
    fVar11 = auVar14._0_4_;
    m->mC3 = fVar11;
    m->mConcavity = auVar12._0_4_;
    if (auVar12._0_4_ < fVar11) {
      m->mConcavity = fVar11;
    }
  }
  return bVar9;
}

Assistant:

bool featureMatch(CTri &m,const CTriVector &tris,ConvexDecompInterface *callback,const CTriVector &input_mesh)
{

  bool ret = false;

  float neardot = 0.707f;

  m.mConcavity = 0;

	//gLog->Display("*********** FEATURE MATCH *************\r\n");
	//gLog->Display("Plane: %0.4f,%0.4f,%0.4f   %0.4f\r\n", m.mNormal.x, m.mNormal.y, m.mNormal.z, m.mPlaneD );
	//gLog->Display("*********************************************\r\n");

	CTriVector::const_iterator i;

	CTri nearest;


	for (i=tris.begin(); i!=tris.end(); ++i)
	{
		const CTri &t = (*i);


  	//gLog->Display("   HullPlane: %0.4f,%0.4f,%0.4f   %0.4f\r\n", t.mNormal.x, t.mNormal.y, t.mNormal.z, t.mPlaneD );

		if ( t.samePlane(m) )
		{
			//gLog->Display("*** PLANE MATCH!!!\r\n");
			ret = false;
			break;
		}

	  float dot = t.mNormal.Dot(m.mNormal);

	  if ( dot > neardot )
	  {

      float d1 = t.planeDistance( m.mP1 );
      float d2 = t.planeDistance( m.mP2 );
      float d3 = t.planeDistance( m.mP3 );

      if ( d1 > 0.001f || d2 > 0.001f || d3 > 0.001f ) // can't be near coplaner!
      {

  	  	neardot = dot;

        Vector3d n1,n2,n3;

        t.raySect( m.mP1, m.mNormal, m.mNear1 );
        t.raySect( m.mP2, m.mNormal, m.mNear2 );
        t.raySect( m.mP3, m.mNormal, m.mNear3 );

				nearest = t;

	  		ret = true;
		  }

	  }
	}

	if ( ret )
	{
    if ( 0 )
    {
      CTriVector::const_iterator i;
      for (i=input_mesh.begin(); i!=input_mesh.end(); ++i)
      {
        const CTri &c = (*i);
        if ( c.mI1 != m.mI1 && c.mI2 != m.mI2 && c.mI3 != m.mI3 )
        {
  			  c.clip( m.mP1, m.mNear1 );
				  c.clip( m.mP2, m.mNear2 );
				  c.clip( m.mP3, m.mNear3 );
        }
      }
    }

	  //gLog->Display("*********************************************\r\n");
  	//gLog->Display("   HullPlaneNearest: %0.4f,%0.4f,%0.4f   %0.4f\r\n", nearest.mNormal.x, nearest.mNormal.y, nearest.mNormal.z, nearest.mPlaneD );

		m.mC1 = m.mP1.Distance( m.mNear1 );
		m.mC2 = m.mP2.Distance( m.mNear2 );
		m.mC3 = m.mP3.Distance( m.mNear3 );

		m.mConcavity = m.mC1;

		if ( m.mC2 > m.mConcavity ) m.mConcavity = m.mC2;
		if ( m.mC3 > m.mConcavity ) m.mConcavity = m.mC3;

    #if 0
		callback->ConvexDebugTri( m.mP1.Ptr(), m.mP2.Ptr(), m.mP3.Ptr(), 0x00FF00 );
		callback->ConvexDebugTri( m.mNear1.Ptr(), m.mNear2.Ptr(), m.mNear3.Ptr(), 0xFF0000 );

		callback->ConvexDebugTri( m.mP1.Ptr(), m.mP1.Ptr(), m.mNear1.Ptr(), 0xFFFF00 );
		callback->ConvexDebugTri( m.mP2.Ptr(), m.mP2.Ptr(), m.mNear2.Ptr(), 0xFFFF00 );
		callback->ConvexDebugTri( m.mP3.Ptr(), m.mP3.Ptr(), m.mNear3.Ptr(), 0xFFFF00 );
    #endif

	}
	else
	{
		//gLog->Display("No match\r\n");
	}

	//gLog->Display("*********************************************\r\n");
	return ret;
}